

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O3

void __thiscall Lexer::lexLine(Lexer *this)

{
  undefined8 uVar1;
  undefined4 uVar2;
  ulong uVar3;
  ulong uVar4;
  Token token;
  Type local_c0;
  undefined1 *local_b0;
  long local_a8;
  undefined1 local_a0 [16];
  undefined1 local_90 [16];
  _Alloc_hider local_80;
  char local_70 [16];
  undefined1 local_60 [16];
  _Alloc_hider local_50;
  char local_40 [16];
  
  uVar3 = (ulong)this->_currentColumnNo;
  uVar4 = (this->_currentLine)._M_string_length;
  if (uVar4 != uVar3) {
    do {
      if (uVar4 <= uVar3) {
        __assert_fail("_currentColumnNo < _currentLine.size()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/cubuspl42[P]aghsm/Lexer.cpp"
                      ,0xb9,"void Lexer::lexLine()");
      }
      local_b0 = local_a0;
      local_a8 = 0;
      local_a0[0] = 0;
      do {
        readToken((Token *)local_60,this);
        uVar2 = local_60._8_4_;
        uVar1 = local_60._0_8_;
        std::__cxx11::string::operator=((string *)&local_b0,(string *)&local_50);
        if (local_50._M_p != local_40) {
          operator_delete(local_50._M_p);
        }
        local_90._0_8_ = uVar1;
        local_90._8_4_ = uVar2;
        local_80._M_p = local_70;
        std::__cxx11::string::_M_construct<char*>((string *)&local_80,local_b0,local_b0 + local_a8);
        emitToken(this,(Token *)local_90);
        if (local_80._M_p != local_70) {
          operator_delete(local_80._M_p);
        }
        local_c0 = (Type)uVar1;
      } while (local_c0 != LineTerminatorToken);
      if (local_b0 != local_a0) {
        operator_delete(local_b0);
      }
      uVar3 = (ulong)this->_currentColumnNo;
      uVar4 = (this->_currentLine)._M_string_length;
    } while (uVar4 != uVar3);
  }
  return;
}

Assistant:

void Lexer::lexLine() {
    while(_currentColumnNo != _currentLine.size()) {
        assert(_currentColumnNo < _currentLine.size());
        Token token{Token::NullToken};
        do {
            token = readToken();
            emitToken(token);
        } while(token.type != Token::LineTerminatorToken);
    }
}